

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Paged_Device.cxx
# Opt level: O0

void __thiscall Fl_Paged_Device::traverse(Fl_Paged_Device *this,Fl_Widget *widget)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  Fl_Widget *this_01;
  undefined4 extraout_var_00;
  Fl_Widget *c;
  int i;
  int n;
  Fl_Group *g;
  Fl_Widget *widget_local;
  Fl_Paged_Device *this_local;
  Fl_Group *this_00;
  
  iVar1 = (*widget->_vptr_Fl_Widget[7])();
  this_00 = (Fl_Group *)CONCAT44(extraout_var,iVar1);
  if (this_00 != (Fl_Group *)0x0) {
    iVar1 = Fl_Group::children(this_00);
    for (c._0_4_ = 0; (int)c < iVar1; c._0_4_ = (int)c + 1) {
      this_01 = Fl_Group::child(this_00,(int)c);
      uVar2 = Fl_Widget::visible(this_01);
      if (uVar2 != 0) {
        iVar3 = (*this_01->_vptr_Fl_Widget[8])();
        if (CONCAT44(extraout_var_00,iVar3) == 0) {
          traverse(this,this_01);
        }
        else {
          uVar2 = Fl_Widget::x(this_01);
          uVar4 = Fl_Widget::y(this_01);
          (*(this->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[0xe])
                    (this,this_01,(ulong)uVar2,(ulong)uVar4);
        }
      }
    }
  }
  return;
}

Assistant:

void Fl_Paged_Device::traverse(Fl_Widget *widget)
{
  Fl_Group *g = widget->as_group();
  if (!g) return;
  int n = g->children();
  for (int i = 0; i < n; i++) {
    Fl_Widget *c = g->child(i);
    if ( !c->visible() ) continue;
    if ( c->as_window() ) {
      print_widget(c, c->x(), c->y());
    }
    else traverse(c);
  }
}